

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueRenderResource.h
# Opt level: O0

void __thiscall
Rml::UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
::ReleaseInDerived(UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                   *this)

{
  Mesh local_40;
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  *local_10;
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  *this_local;
  
  local_10 = this;
  Rml::Geometry::Release((ReleaseMode)&local_40);
  Mesh::~Mesh(&local_40);
  return;
}

Assistant:

void MoveFrom(UniqueRenderResource& other) noexcept
	{
		render_manager = std::exchange(other.render_manager, nullptr);
		resource_handle = std::exchange(other.resource_handle, InvalidHandleValue);
	}